

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmListFileContext * __thiscall
cmMakefile::GetExecutionContext(cmListFileContext *__return_storage_ptr__,cmMakefile *this)

{
  cmListFileContext *pcVar1;
  pointer pcVar2;
  
  pcVar1 = (this->CallStack).
           super__Vector_base<cmMakefile::CallStackEntry,_std::allocator<cmMakefile::CallStackEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].Context;
  (__return_storage_ptr__->Name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->Name).field_2
  ;
  pcVar2 = (pcVar1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pcVar1->Name)._M_string_length);
  (__return_storage_ptr__->FilePath)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->FilePath).field_2;
  pcVar2 = (pcVar1->FilePath)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->FilePath,pcVar2,
             pcVar2 + (pcVar1->FilePath)._M_string_length);
  __return_storage_ptr__->Line = pcVar1->Line;
  return __return_storage_ptr__;
}

Assistant:

cmListFileContext cmMakefile::GetExecutionContext() const
{
  return *this->CallStack.back().Context;
}